

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  bad_alloc *anon_var_0;
  string local_120 [55];
  allocator local_e9;
  string local_e8 [32];
  _union_1457 _Stack_c8;
  sigaction sa;
  uint local_24;
  int local_20;
  int streamType;
  int maxsampleindex;
  int opt;
  char **argv_local;
  int argc_local;
  
  local_20 = -1;
  local_24 = 2;
  while (iVar1 = getopt(argc,argv,"vhS:t:"), iVar1 != -1) {
    switch(iVar1) {
    case 0x53:
      local_20 = atoi(_optarg);
      break;
    case 0x68:
    default:
      help();
      exit(1);
    case 0x74:
      local_24 = atoi(_optarg);
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      exit(1);
    }
  }
  progname = *argv;
  sa.sa_mask.__val[0xe] = 0;
  sa.sa_mask.__val[0xf] = 0;
  sa.sa_mask.__val[0xc] = 0;
  sa.sa_mask.__val[0xd] = 0;
  sa.sa_mask.__val[10] = 0;
  sa.sa_mask.__val[0xb] = 0;
  sa.sa_mask.__val[8] = 0;
  sa.sa_mask.__val[9] = 0;
  sa.sa_mask.__val[6] = 0;
  sa.sa_mask.__val[7] = 0;
  sa.sa_mask.__val[4] = 0;
  sa.sa_mask.__val[5] = 0;
  sa.sa_mask.__val[2] = 0;
  sa.sa_mask.__val[3] = 0;
  sa.sa_mask.__val[0] = 0;
  sa.sa_mask.__val[1] = 0;
  _Stack_c8.sa_handler = (__sighandler_t)0x0;
  sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
  sa.sa_flags = 0;
  sa._140_4_ = 0;
  sigemptyset((sigset_t *)&sa);
  _Stack_c8.sa_handler = segfault_sigaction;
  sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
  sigaction(0xb,(sigaction *)&_Stack_c8,(sigaction *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"",(allocator *)((long)&anon_var_0 + 7));
  initstreams((string *)local_e8,(string *)local_120);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  if (local_20 == -1) {
    fprintf(_stderr,
            "FATAL: Sample size not supplied - please use -S parameter followed by the sample size\n"
           );
    exit(1);
  }
  if ((local_24 != 1) && (local_24 != 2)) {
    fprintf(_stderr,
            "FATAL: Unknown stream type %d - please use 1 for item stream or 2 for loss stream\n",
            (ulong)local_24);
    exit(1);
  }
  gultobin::doit(local_20,local_24);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

	int opt;
	int maxsampleindex = -1;
	int streamType = 2;
	while ((opt = getopt(argc, argv, "vhS:t:")) != -1) {
		switch (opt) {
		case 'S':
			maxsampleindex = atoi(optarg);
			break;
		case 't':
			streamType = atoi(optarg);
			break;
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}
	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
		if (maxsampleindex == -1) {
			fprintf(stderr, "FATAL: Sample size not supplied - please use -S parameter followed by the sample size\n");
			exit(EXIT_FAILURE);
		}
		if (streamType != 1 && streamType != 2) {
			fprintf(stderr, "FATAL: Unknown stream type %d - please use 1 for item stream or 2 for loss stream\n", streamType);
			exit(EXIT_FAILURE);
		}
		gultobin::doit(maxsampleindex, streamType);

		return EXIT_SUCCESS;
	}catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}

}